

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O1

void __thiscall JAMA::Eigenvalue<double>::hqr2(Eigenvalue<double> *this)

{
  double dVar1;
  double **ppdVar2;
  double *pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  double **ppdVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  uint uVar11;
  uint uVar12;
  long *plVar13;
  int i;
  uint uVar14;
  double *pdVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  double **ppdVar29;
  ulong uVar30;
  uint uVar31;
  int j;
  long lVar32;
  int iVar33;
  ulong uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 uVar37;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar38;
  undefined4 extraout_XMM0_Dd_01;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  undefined1 auVar43 [16];
  double dVar44;
  double dVar45;
  double dVar46;
  undefined8 uVar47;
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  undefined1 auVar53 [16];
  double dVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  double dVar57;
  double local_140;
  double local_138;
  
  uVar14 = this->n;
  lVar32 = (long)(int)uVar14;
  auVar50 = ZEXT816(0);
  dVar52 = 0.0;
  if (0 < lVar32) {
    lVar18 = 0;
    do {
      iVar33 = 1;
      if (1 < (int)lVar18) {
        iVar33 = (int)lVar18;
      }
      if (iVar33 <= (int)uVar14) {
        lVar27 = 0;
        do {
          dVar52 = dVar52 + ABS((this->H).data_[lVar18][(ulong)(iVar33 - 1) + lVar27]);
          lVar27 = lVar27 + 1;
        } while ((uVar14 + 1) - iVar33 != (int)lVar27);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar32);
  }
  uVar11 = uVar14 - 1;
  auVar55 = ZEXT816(0);
  auVar53 = ZEXT816(0);
  if (0 < (int)uVar14) {
    auVar53 = ZEXT816(0);
    local_140 = 0.0;
    dVar57 = 0.0;
    iVar33 = 0;
    auVar50 = ZEXT816(0);
    uVar22 = uVar11;
    do {
      uVar28 = (ulong)uVar22;
      uVar19 = (ulong)uVar22;
      if (0 < (int)uVar22) {
        ppdVar2 = (this->H).data_;
        uVar19 = uVar28;
        do {
          pdVar3 = ppdVar2[uVar19];
          dVar40 = ABS(pdVar3[uVar19]) + ABS(ppdVar2[uVar19 - 1][uVar19 - 1]);
          uVar34 = -(ulong)(dVar40 == 0.0);
          dVar40 = (double)(uVar34 & (ulong)dVar52 | ~uVar34 & (ulong)dVar40);
          auVar55._8_8_ = 0;
          auVar55._0_8_ = dVar40;
          if (ABS(pdVar3[uVar19 - 1]) < dVar40 * 2.220446049250313e-16) goto LAB_0022a36e;
          bVar7 = 1 < (long)uVar19;
          uVar19 = uVar19 - 1;
        } while (bVar7);
        uVar19 = 0;
      }
LAB_0022a36e:
      uVar25 = (uint)uVar19;
      if (uVar25 == uVar22) {
        pdVar3 = (this->H).data_[uVar28];
        dVar40 = pdVar3[uVar28] + local_140;
        pdVar3[uVar28] = dVar40;
        (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar28] = dVar40;
        (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar28] = 0.0;
        uVar22 = uVar22 - 1;
LAB_0022a85a:
        iVar33 = 0;
      }
      else {
        uVar31 = uVar22 - 1;
        if (uVar25 == uVar31) {
          ppdVar2 = (this->H).data_;
          pdVar3 = ppdVar2[uVar28];
          pdVar15 = ppdVar2[uVar31];
          dVar41 = pdVar3[uVar31] * pdVar15[uVar28];
          dVar57 = (pdVar15[uVar31] - pdVar3[uVar28]) * 0.5;
          dVar45 = dVar57 * dVar57 + dVar41;
          dVar40 = ABS(dVar45);
          if (dVar40 < 0.0) {
            dVar40 = sqrt(dVar40);
            uVar19 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
          }
          else {
            dVar40 = SQRT(dVar40);
            uVar19 = 0;
          }
          ppdVar2 = (this->H).data_;
          pdVar3 = ppdVar2[uVar28];
          pdVar3[uVar28] = pdVar3[uVar28] + local_140;
          pdVar15 = ppdVar2[uVar31];
          pdVar15[uVar31] = pdVar15[uVar31] + local_140;
          dVar54 = pdVar3[uVar28];
          if (0.0 <= dVar45) {
            dVar57 = (double)(~-(ulong)(dVar57 < 0.0) & (ulong)dVar40 |
                             (ulong)-dVar40 & -(ulong)(dVar57 < 0.0)) + dVar57;
            pdVar4 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar4[(int)uVar31] = dVar57 + dVar54;
            pdVar4[uVar28] =
                 (double)(-(ulong)(dVar57 != 0.0) & (ulong)(dVar54 - dVar41 / dVar57) |
                         ~-(ulong)(dVar57 != 0.0) & (ulong)(dVar57 + dVar54));
            pdVar4 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar4[(int)uVar31] = 0.0;
            pdVar4[uVar28] = 0.0;
            auVar55._8_8_ = uVar19 & 0x7fffffffffffffff;
            auVar55._0_8_ = ABS(dVar57) + ABS(pdVar3[uVar31]);
            dVar40 = pdVar3[uVar31] / auVar55._0_8_;
            dVar41 = dVar57 / auVar55._0_8_;
            dVar57 = dVar40 * dVar40 + dVar41 * dVar41;
            if (dVar57 < 0.0) {
              dVar57 = sqrt(dVar57);
              auVar50._12_4_ = extraout_XMM0_Dd_00;
              auVar50._8_4_ = extraout_XMM0_Dc_00;
              auVar50._0_8_ = dVar57;
            }
            else {
              auVar50._0_8_ = SQRT(dVar57);
              auVar50._8_8_ = 0.0;
            }
            dVar57 = dVar40 / auVar50._0_8_;
            dVar41 = dVar41 / auVar50._0_8_;
            if ((int)uVar22 <= (int)uVar14) {
              ppdVar2 = (this->H).data_;
              pdVar3 = ppdVar2[uVar31];
              pdVar15 = ppdVar2[uVar28];
              uVar25 = uVar31;
              do {
                dVar40 = pdVar3[uVar25];
                pdVar3[uVar25] = dVar41 * dVar40 + pdVar15[uVar25] * dVar57;
                pdVar15[uVar25] = pdVar15[uVar25] * dVar41 + dVar40 * -dVar57;
                uVar25 = uVar25 + 1;
              } while (uVar14 != uVar25);
            }
            if (-1 < (int)uVar22) {
              ppdVar2 = (this->H).data_;
              uVar19 = 0;
              do {
                pdVar3 = ppdVar2[uVar19];
                dVar40 = pdVar3[uVar31];
                dVar45 = pdVar3[uVar28];
                pdVar3[uVar31] = dVar41 * dVar40 + dVar57 * dVar45;
                pdVar3[uVar28] = dVar45 * dVar41 + dVar40 * -dVar57;
                uVar19 = uVar19 + 1;
              } while (uVar22 + 1 != uVar19);
            }
            ppdVar2 = (this->V).data_;
            lVar18 = 0;
            do {
              pdVar3 = ppdVar2[lVar18];
              dVar40 = pdVar3[uVar31];
              dVar45 = pdVar3[uVar28];
              pdVar3[uVar31] = dVar41 * dVar40 + dVar57 * dVar45;
              pdVar3[uVar28] = dVar45 * dVar41 + dVar40 * -dVar57;
              lVar18 = lVar18 + 1;
            } while (lVar32 != lVar18);
            auVar53._8_8_ = dVar41;
            auVar53._0_8_ = dVar40;
          }
          else {
            pdVar4 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar4[(int)uVar31] = dVar54 + dVar57;
            pdVar4[uVar28] = dVar54 + dVar57;
            pdVar4 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar4[(int)uVar31] = dVar40;
            pdVar4[uVar28] = -dVar40;
            auVar53._8_8_ = dVar45;
            auVar53._0_8_ = dVar40;
          }
          uVar22 = uVar22 - 2;
          goto LAB_0022a85a;
        }
        ppdVar2 = (this->H).data_;
        pdVar3 = ppdVar2[uVar28];
        dVar40 = 0.0;
        local_138 = 0.0;
        if ((int)uVar25 < (int)uVar22) {
          local_138 = ppdVar2[uVar31][uVar31];
          dVar40 = pdVar3[uVar31] * ppdVar2[uVar31][uVar28];
        }
        dVar41 = pdVar3[uVar28];
        if (iVar33 == 10) {
          if (-1 < (int)uVar22) {
            uVar19 = 0;
            do {
              ppdVar2[uVar19][uVar19] = ppdVar2[uVar19][uVar19] - dVar41;
              uVar19 = uVar19 + 1;
            } while (uVar22 + 1 != uVar19);
          }
          local_140 = local_140 + dVar41;
          auVar55._0_8_ = ABS(ppdVar2[uVar31][uVar22 - 2]) + ABS(pdVar3[uVar31]);
          auVar55._8_8_ = 0;
          dVar41 = auVar55._0_8_ * 0.75;
          dVar40 = auVar55._0_8_ * -0.4375 * auVar55._0_8_;
          local_138 = dVar41;
        }
        if (iVar33 == 0x1e) {
          dVar45 = (local_138 - dVar41) * 0.5;
          auVar55._0_8_ = dVar45 * dVar45 + dVar40;
          auVar55._8_8_ = 0;
          if (0.0 < auVar55._0_8_) {
            if (auVar55._0_8_ < 0.0) {
              dVar54 = sqrt(auVar55._0_8_);
            }
            else {
              dVar54 = SQRT(auVar55._0_8_);
            }
            dVar41 = dVar41 - dVar40 / (dVar45 + (double)(~-(ulong)(local_138 < dVar41) &
                                                          (ulong)dVar54 |
                                                         (ulong)-dVar54 &
                                                         -(ulong)(local_138 < dVar41)));
            if (-1 < (int)uVar22) {
              ppdVar2 = (this->H).data_;
              uVar19 = 0;
              do {
                pdVar3 = ppdVar2[uVar19];
                pdVar3[uVar19] = pdVar3[uVar19] - dVar41;
                uVar19 = uVar19 + 1;
              } while (uVar22 + 1 != uVar19);
            }
            local_140 = local_140 + dVar41;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = dVar41;
            dVar40 = 0.964;
            dVar41 = 0.964;
            local_138 = 0.964;
          }
        }
        uVar26 = uVar22 - 2;
        if ((int)uVar25 <= (int)uVar26) {
          ppdVar2 = (this->H).data_;
          uVar19 = (ulong)uVar22;
          do {
            iVar10 = (int)uVar19;
            uVar26 = iVar10 - 2;
            pdVar3 = ppdVar2[uVar26];
            dVar45 = pdVar3[uVar26];
            uVar28 = (ulong)(iVar10 - 1);
            dVar54 = ppdVar2[uVar28][uVar28];
            dVar57 = ((dVar41 - dVar45) * (local_138 - dVar45) + -dVar40) / ppdVar2[uVar28][uVar26]
                     + pdVar3[uVar28];
            auVar49._0_8_ = ((dVar54 - dVar45) - (dVar41 - dVar45)) - (local_138 - dVar45);
            auVar49._8_8_ = ppdVar2[uVar19][uVar28];
            auVar55._0_8_ = ABS(ppdVar2[uVar19][uVar28]) + ABS(auVar49._0_8_) + ABS(dVar57);
            auVar55._8_8_ = 0;
            dVar57 = dVar57 / auVar55._0_8_;
            auVar51._8_8_ = auVar55._0_8_;
            auVar51._0_8_ = auVar55._0_8_;
            auVar50 = divpd(auVar49,auVar51);
            uVar26 = uVar25;
            if (uVar25 + 2 == iVar10) goto LAB_0022aaa9;
            uVar26 = iVar10 - 3;
            uVar19 = uVar28;
          } while ((ABS(dVar45) + ABS(ppdVar2[uVar26][uVar26]) + ABS(dVar54)) * ABS(dVar57) *
                   2.220446049250313e-16 <=
                   (ABS(auVar50._8_8_) + ABS(auVar50._0_8_)) * ABS(pdVar3[uVar26]));
          uVar26 = iVar10 - 2;
LAB_0022aaa9:
          auVar53._8_8_ = auVar50._0_8_;
          auVar53._0_8_ = dVar45;
          auVar50._0_8_ = auVar50._8_8_;
        }
        if ((int)(uVar26 + 2) <= (int)uVar22) {
          ppdVar2 = (this->H).data_;
          uVar20 = uVar26;
          do {
            pdVar3 = ppdVar2[uVar20 + 2];
            pdVar3[uVar20] = 0.0;
            if ((int)(uVar26 + 2) < (int)(uVar20 + 2)) {
              pdVar3[uVar20 - 1] = 0.0;
            }
            uVar20 = uVar20 + 1;
          } while (uVar22 - 1 != uVar20);
        }
        iVar33 = iVar33 + 1;
        if ((int)uVar26 < (int)uVar22) {
          uVar35 = auVar50._0_4_;
          uVar36 = auVar50._4_4_;
          uVar37 = auVar53._8_4_;
          uVar38 = auVar53._12_4_;
          uVar20 = uVar26;
          do {
            uVar19 = (ulong)uVar20;
            auVar50._4_4_ = uVar36;
            auVar50._0_4_ = uVar35;
            auVar50._12_4_ = uVar38;
            auVar50._8_4_ = uVar37;
            if (uVar20 != uVar26) {
              uVar12 = uVar20 - 1;
              ppdVar2 = (this->H).data_;
              dVar40 = 0.0;
              if (uVar20 != uVar31) {
                dVar40 = ppdVar2[uVar20 + 2][uVar12];
              }
              dVar57 = ppdVar2[uVar19][uVar12];
              auVar50._8_8_ = ppdVar2[uVar20 + 1][uVar12];
              auVar50._0_8_ = dVar40;
              dVar41 = ABS(dVar40) + ABS(ppdVar2[uVar20 + 1][uVar12]) + ABS(dVar57);
              if ((dVar41 != 0.0) || (NAN(dVar41))) {
                dVar57 = dVar57 / dVar41;
                auVar8._8_4_ = SUB84(dVar41,0);
                auVar8._0_8_ = dVar41;
                auVar8._12_4_ = (int)((ulong)dVar41 >> 0x20);
                auVar50 = divpd(auVar50,auVar8);
              }
            }
            dVar45 = auVar50._0_8_;
            auVar53._8_8_ = auVar50._8_8_;
            dVar40 = dVar41;
            if ((dVar41 != 0.0) || (NAN(dVar41))) {
              uVar35 = auVar50._8_4_;
              uVar36 = auVar50._12_4_;
              dVar54 = dVar45 * dVar45 + dVar57 * dVar57 + auVar50._8_8_ * auVar50._8_8_;
              if (dVar54 < 0.0) {
                dVar54 = sqrt(dVar54);
                uVar35 = extraout_XMM0_Dc_01;
                uVar36 = extraout_XMM0_Dd_01;
              }
              else {
                dVar54 = SQRT(dVar54);
              }
              dVar42 = -dVar54;
              auVar43._0_8_ = -(ulong)(dVar57 < 0.0) & (ulong)dVar42;
              auVar43._8_8_ = 0;
              auVar56._0_8_ = ~-(ulong)(dVar57 < 0.0) & (ulong)dVar54;
              auVar56._12_4_ = uVar36;
              auVar56._8_4_ = uVar35;
              auVar55 = auVar56 | auVar43;
              if ((dVar54 != dVar42) || (NAN(dVar54) || NAN(dVar42))) {
                dVar54 = auVar55._0_8_;
                if (uVar20 == uVar26) {
                  if (uVar25 != uVar26) {
                    pdVar3 = (this->H).data_[uVar19];
                    pdVar3[uVar20 - 1] = -pdVar3[uVar20 - 1];
                  }
                }
                else {
                  (this->H).data_[uVar19][uVar20 - 1] = -dVar54 * dVar41;
                }
                dVar57 = dVar57 + dVar54;
                dVar40 = dVar57 / dVar54;
                dVar42 = auVar50._8_8_ / dVar54;
                auVar9._8_4_ = SUB84(dVar57,0);
                auVar9._0_8_ = dVar54;
                auVar9._12_4_ = (int)((ulong)dVar57 >> 0x20);
                auVar53 = divpd(auVar50,auVar9);
                auVar50._0_8_ = dVar45 / dVar57;
                dVar54 = auVar53._8_8_;
                dVar45 = auVar53._0_8_;
                if ((int)uVar20 < (int)uVar14) {
                  ppdVar2 = (this->H).data_;
                  pdVar3 = ppdVar2[uVar19];
                  pdVar15 = ppdVar2[uVar20 + 1];
                  uVar28 = uVar19;
                  do {
                    dVar57 = pdVar15[uVar28] * dVar54 + pdVar3[uVar28];
                    if (uVar20 != uVar31) {
                      dVar48 = ppdVar2[uVar20 + 2][uVar28];
                      dVar57 = dVar57 + auVar50._0_8_ * dVar48;
                      ppdVar2[uVar20 + 2][uVar28] = dVar48 - dVar57 * dVar45;
                    }
                    pdVar3[uVar28] = pdVar3[uVar28] - dVar57 * dVar40;
                    pdVar15[uVar28] = pdVar15[uVar28] - dVar57 * dVar42;
                    uVar12 = (int)uVar28 + 1;
                    uVar28 = (ulong)uVar12;
                  } while ((int)uVar12 < (int)uVar14);
                }
                uVar12 = uVar20 + 3;
                if ((int)uVar22 <= (int)(uVar20 + 3)) {
                  uVar12 = uVar22;
                }
                if (-1 < (int)uVar12) {
                  ppdVar2 = (this->H).data_;
                  uVar17 = uVar20 + 1;
                  uVar28 = 0xffffffffffffffff;
                  do {
                    pdVar3 = ppdVar2[uVar28 + 1];
                    dVar57 = pdVar3[uVar19] * dVar40 + pdVar3[uVar17] * dVar42;
                    if (uVar20 != uVar31) {
                      dVar57 = dVar57 + dVar45 * pdVar3[uVar20 + 2];
                      pdVar3[uVar20 + 2] = pdVar3[uVar20 + 2] - dVar57 * auVar50._0_8_;
                    }
                    pdVar3[uVar19] = pdVar3[uVar19] - dVar57;
                    pdVar3[uVar17] = pdVar3[uVar17] - dVar57 * dVar54;
                    uVar28 = uVar28 + 1;
                  } while (uVar28 < uVar12);
                }
                ppdVar2 = (this->V).data_;
                uVar12 = uVar20 + 1;
                lVar18 = 0;
                do {
                  pdVar3 = ppdVar2[lVar18];
                  dVar57 = pdVar3[uVar19] * dVar40 + pdVar3[uVar12] * dVar42;
                  if (uVar20 != uVar31) {
                    dVar57 = dVar57 + dVar45 * pdVar3[uVar20 + 2];
                    pdVar3[uVar20 + 2] = pdVar3[uVar20 + 2] - dVar57 * auVar50._0_8_;
                  }
                  pdVar3[uVar19] = pdVar3[uVar19] - dVar57;
                  pdVar3[uVar12] = pdVar3[uVar12] - dVar57 * dVar54;
                  lVar18 = lVar18 + 1;
                } while (lVar32 != lVar18);
              }
            }
            if ((dVar41 == 0.0) && (!NAN(dVar41))) break;
            uVar20 = uVar20 + 1;
            uVar37 = auVar53._8_4_;
            uVar38 = auVar53._12_4_;
            uVar35 = auVar50._0_4_;
            uVar36 = auVar50._4_4_;
            dVar41 = dVar40;
          } while ((int)uVar20 < (int)uVar22);
        }
      }
    } while (-1 < (int)uVar22);
  }
  if ((dVar52 != 0.0) || (NAN(dVar52))) {
    if (0 < (int)uVar14) {
      uVar31 = uVar14 - 3;
      uVar25 = uVar14 - 2;
      uVar19 = (ulong)uVar11;
      uVar22 = uVar14;
      do {
        uVar28 = (ulong)uVar31;
        pdVar4 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar57 = pdVar4[uVar19];
        dVar40 = pdVar5[uVar19];
        if ((dVar40 != 0.0) || (NAN(dVar40))) {
          if (dVar40 < 0.0) {
            uVar34 = uVar19 - 1;
            ppdVar2 = (this->H).data_;
            pdVar3 = ppdVar2[uVar19];
            uVar21 = uVar34 & 0xffffffff;
            pdVar15 = ppdVar2[uVar21];
            if (ABS(pdVar3[uVar21]) <= ABS(pdVar15[uVar19])) {
              cdiv(this,0.0,-pdVar15[uVar19],pdVar15[uVar21] - dVar57,dVar40);
              pdVar3 = (this->H).data_[uVar21];
              pdVar3[uVar21] = this->cdivr;
              pdVar3[uVar19] = this->cdivi;
            }
            else {
              pdVar15[uVar21] = dVar40 / pdVar3[uVar21];
              pdVar15[uVar19] = -(pdVar3[uVar19] - dVar57) / pdVar3[uVar21];
            }
            pdVar3 = (this->H).data_[uVar19];
            pdVar3[uVar21] = 0.0;
            pdVar3[uVar19] = 1.0;
            if (1 < (long)uVar19) {
              lVar27 = uVar28 << 0x20;
              lVar18 = uVar28 * 8;
              dVar41 = -dVar40;
              dVar45 = auVar53._0_8_;
              uVar47 = auVar53._8_8_;
              dVar54 = auVar55._0_8_;
              auVar51 = auVar50;
              do {
                auVar50 = ZEXT816(0);
                if ((long)(int)uVar34 <= (long)uVar19) {
                  ppdVar2 = (this->H).data_;
                  uVar23 = uVar34 & 0xffffffff;
                  do {
                    pdVar3 = ppdVar2[uVar23];
                    dVar42 = ppdVar2[uVar28][uVar23];
                    dVar48 = auVar50._8_8_;
                    auVar50._0_8_ = auVar50._0_8_ + pdVar3[uVar21] * dVar42;
                    auVar50._8_8_ = dVar48 + pdVar3[uVar19] * dVar42;
                    uVar26 = (int)uVar23 + 1;
                    uVar23 = (ulong)uVar26;
                  } while (uVar22 != uVar26);
                }
                ppdVar2 = (this->H).data_;
                pdVar3 = ppdVar2[uVar28];
                auVar53._0_8_ = pdVar3[uVar28] - dVar57;
                auVar53._8_8_ = 0;
                dVar42 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar28];
                dVar48 = auVar50._0_8_;
                dVar44 = auVar50._8_8_;
                auVar55._8_8_ = (ulong)dVar44;
                auVar55._0_8_ = dVar44;
                iVar33 = (int)uVar28;
                if (0.0 <= dVar42) {
                  if ((dVar42 != 0.0) || (NAN(dVar42))) {
                    dVar1 = pdVar3[uVar28 + 1];
                    dVar39 = ppdVar2[uVar28 + 1][uVar28];
                    dVar46 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar28] - dVar57;
                    dVar42 = dVar41 * dVar40 + dVar46 * dVar46 + dVar42 * dVar42;
                    dVar46 = (dVar46 + dVar46) * dVar40;
                    if ((dVar42 == 0.0) && (((!NAN(dVar42) && (dVar46 == 0.0)) && (!NAN(dVar46)))))
                    {
                      dVar42 = (ABS(dVar45) +
                               ABS(dVar39) + ABS(dVar1) + ABS(auVar53._0_8_) + ABS(dVar40)) *
                               dVar52 * 2.220446049250313e-16;
                    }
                    cdiv(this,dVar40 * dVar44 + (dVar1 * auVar51._0_8_ - dVar48 * dVar45),
                         dVar41 * dVar48 + (dVar1 * dVar54 - dVar44 * dVar45),dVar42,dVar46);
                    dVar42 = this->cdivr;
                    ppdVar2 = (this->H).data_;
                    pdVar3 = ppdVar2[uVar28];
                    pdVar3[uVar21] = dVar42;
                    dVar46 = this->cdivi;
                    pdVar3[uVar19] = dVar46;
                    if (ABS(dVar1) <= ABS(dVar45) + ABS(dVar40)) {
                      dVar39 = -dVar39;
                      cdiv(this,dVar42 * dVar39 - auVar51._0_8_,dVar39 * dVar46 - dVar54,dVar45,
                           dVar40);
                      pdVar15 = (this->H).data_[uVar28 + 1];
                      pdVar15[uVar21] = this->cdivr;
                      dVar1 = this->cdivi;
                    }
                    else {
                      pdVar15 = ppdVar2[uVar28 + 1];
                      pdVar15[uVar21] =
                           (dVar46 * dVar40 + (-auVar53._0_8_ * dVar42 - dVar48)) / dVar1;
                      dVar1 = (pdVar3[uVar21] * dVar41 + (pdVar3[uVar19] * -auVar53._0_8_ - dVar44))
                              / dVar1;
                    }
                  }
                  else {
                    cdiv(this,-dVar48,-dVar44,auVar53._0_8_,dVar40);
                    pdVar15 = (this->H).data_[uVar28];
                    pdVar15[uVar21] = this->cdivr;
                    dVar1 = this->cdivi;
                  }
                  pdVar15[uVar19] = dVar1;
                  ppdVar2 = (this->H).data_;
                  pdVar3 = ppdVar2[uVar28];
                  dVar48 = ABS(pdVar3[uVar21]);
                  dVar42 = ABS(pdVar3[uVar19]);
                  if (dVar42 <= dVar48) {
                    dVar42 = dVar48;
                  }
                  if ((1.0 < dVar42 * 2.220446049250313e-16 * dVar42) &&
                     ((long)iVar33 <= (long)uVar19)) {
                    plVar13 = (long *)((long)ppdVar2 + lVar18);
                    lVar16 = lVar27;
                    do {
                      lVar24 = *plVar13;
                      *(double *)(lVar24 + uVar21 * 8) = *(double *)(lVar24 + uVar21 * 8) / dVar42;
                      *(double *)(lVar24 + uVar19 * 8) = *(double *)(lVar24 + uVar19 * 8) / dVar42;
                      lVar24 = lVar16 >> 0x20;
                      lVar16 = lVar16 + 0x100000000;
                      plVar13 = plVar13 + 1;
                    } while (lVar24 < (long)uVar19);
                  }
                  auVar53._8_8_ = uVar47;
                  auVar53._0_8_ = dVar45;
                  auVar55._8_8_ = 0;
                  auVar55._0_8_ = dVar54;
                  uVar34 = uVar28 & 0xffffffff;
                  auVar50 = auVar51;
                }
                uVar28 = uVar28 - 1;
                lVar27 = lVar27 + -0x100000000;
                lVar18 = lVar18 + -8;
                dVar45 = auVar53._0_8_;
                uVar47 = auVar53._8_8_;
                dVar54 = auVar55._0_8_;
                auVar51 = auVar50;
              } while (0 < iVar33);
            }
          }
        }
        else {
          ppdVar2 = (this->H).data_;
          ppdVar2[uVar19][uVar19] = 1.0;
          if (0 < (long)uVar19) {
            uVar34 = uVar19 & 0xffffffff;
            uVar28 = uVar19;
            uVar26 = uVar25;
            do {
              uVar23 = uVar28 - 1;
              uVar30 = uVar23 & 0xffffffff;
              pdVar3 = ppdVar2[uVar30];
              auVar50 = ZEXT816(0);
              uVar21 = uVar34;
              if ((long)(int)uVar34 <= (long)uVar19) {
                do {
                  auVar50._0_8_ = auVar50._0_8_ + pdVar3[uVar21] * ppdVar2[uVar21][uVar19];
                  uVar20 = (int)uVar21 + 1;
                  uVar21 = (ulong)uVar20;
                } while (uVar22 != uVar20);
              }
              dVar41 = pdVar3[uVar30] - dVar57;
              dVar40 = pdVar5[uVar30];
              dVar45 = auVar50._0_8_;
              if (0.0 <= dVar40) {
                if ((dVar40 != 0.0) || (NAN(dVar40))) {
                  dVar54 = pdVar3[uVar28];
                  pdVar15 = ppdVar2[uVar28];
                  dVar42 = pdVar15[uVar30];
                  dVar48 = pdVar4[uVar30] - dVar57;
                  dVar44 = auVar53._0_8_;
                  dVar40 = (dVar54 * auVar55._0_8_ - dVar45 * dVar44) /
                           (dVar48 * dVar48 + dVar40 * dVar40);
                  pdVar3[uVar19] = dVar40;
                  if (ABS(dVar54) <= ABS(dVar44)) {
                    pdVar15[uVar19] = (-dVar42 * dVar40 - auVar55._0_8_) / dVar44;
                  }
                  else {
                    pdVar15[uVar19] = (-dVar41 * dVar40 - dVar45) / dVar54;
                  }
                }
                else {
                  if ((dVar41 == 0.0) && (!NAN(dVar41))) {
                    dVar41 = dVar52 * 2.220446049250313e-16;
                  }
                  pdVar3[uVar19] = -dVar45 / dVar41;
                }
                dVar40 = ABS(pdVar3[uVar19]);
                if ((1.0 < dVar40 * 2.220446049250313e-16 * dVar40) &&
                   ((long)(int)uVar23 <= (long)uVar19)) {
                  ppdVar29 = ppdVar2 + uVar26;
                  lVar18 = (ulong)uVar26 << 0x20;
                  do {
                    (*ppdVar29)[uVar19] = (*ppdVar29)[uVar19] / dVar40;
                    lVar27 = lVar18 >> 0x20;
                    lVar18 = lVar18 + 0x100000000;
                    ppdVar29 = ppdVar29 + 1;
                  } while (lVar27 < (long)uVar19);
                }
                uVar34 = uVar23 & 0xffffffff;
              }
              else {
                auVar53._8_8_ = 0;
                auVar53._0_8_ = dVar41;
                auVar55 = auVar50;
              }
              uVar26 = uVar26 - 1;
              iVar33 = (int)uVar28;
              uVar28 = uVar23;
            } while (1 < iVar33);
          }
        }
        uVar22 = uVar22 - 1;
        uVar31 = uVar31 - 1;
        uVar25 = uVar25 - 1;
        bVar7 = 0 < (long)uVar19;
        uVar19 = uVar19 - 1;
      } while (bVar7);
    }
    if (0 < (int)uVar14) {
      ppdVar2 = (this->V).data_;
      uVar19 = (ulong)uVar11;
      do {
        uVar14 = (uint)uVar19;
        if ((int)uVar11 < (int)(uint)uVar19) {
          uVar14 = uVar11;
        }
        ppdVar29 = (this->V).data_;
        ppdVar6 = (this->H).data_;
        lVar18 = 0;
        do {
          if ((int)uVar14 < 0) {
            dVar52 = 0.0;
          }
          else {
            dVar52 = 0.0;
            lVar27 = -1;
            do {
              dVar52 = dVar52 + ppdVar29[lVar18][lVar27 + 1] * ppdVar6[lVar27 + 1][uVar19];
              lVar27 = lVar27 + 1;
            } while (lVar27 < (int)uVar14);
          }
          ppdVar2[lVar18][uVar19] = dVar52;
          lVar18 = lVar18 + 1;
        } while (lVar18 != lVar32);
        bVar7 = 0 < (long)uVar19;
        uVar19 = uVar19 - 1;
      } while (bVar7);
    }
  }
  return;
}

Assistant:

void hqr2() {
      //  This is derived from the Algol procedure hqr2,
      //  by Martin and Wilkinson, Handbook for Auto. Comp.,
      //  Vol.ii-Linear Algebra, and the corresponding
      //  Fortran subroutine in EISPACK.

      // Initialize

      int nn       = this->n;
      int n        = nn - 1;
      int low      = 0;
      int high     = nn - 1;
      Real eps     = pow(2.0, -52.0);
      Real exshift = 0.0;
      Real p = 0, q = 0, r = 0, s = 0, z = 0, t, w, x, y;

      // Store roots isolated by balanc and compute matrix norm

      Real norm = 0.0;
      for (int i = 0; i < nn; i++) {
        if ((i < low) || (i > high)) {
          d(i) = H(i, i);
          e(i) = 0.0;
        }
        for (int j = max(i - 1, 0); j < nn; j++) {
          norm = norm + abs(H(i, j));
        }
      }

      // Outer loop over eigenvalue index

      int iter = 0;
      while (n >= low) {
        // Look for single small sub-diagonal element

        int l = n;
        while (l > low) {
          s = abs(H(l - 1, l - 1)) + abs(H(l, l));
          if (s == 0.0) { s = norm; }
          if (abs(H(l, l - 1)) < eps * s) { break; }
          l--;
        }

        // Check for convergence
        // One root found

        if (l == n) {
          H(n, n) = H(n, n) + exshift;
          d(n)    = H(n, n);
          e(n)    = 0.0;
          n--;
          iter = 0;

          // Two roots found

        } else if (l == n - 1) {
          w               = H(n, n - 1) * H(n - 1, n);
          p               = (H(n - 1, n - 1) - H(n, n)) / 2.0;
          q               = p * p + w;
          z               = sqrt(abs(q));
          H(n, n)         = H(n, n) + exshift;
          H(n - 1, n - 1) = H(n - 1, n - 1) + exshift;
          x               = H(n, n);

          // Real pair

          if (q >= 0) {
            if (p >= 0) {
              z = p + z;
            } else {
              z = p - z;
            }
            d(n - 1) = x + z;
            d(n)     = d(n - 1);
            if (z != 0.0) { d(n) = x - w / z; }
            e(n - 1) = 0.0;
            e(n)     = 0.0;
            x        = H(n, n - 1);
            s        = abs(x) + abs(z);
            p        = x / s;
            q        = z / s;
            r        = sqrt(p * p + q * q);
            p        = p / r;
            q        = q / r;

            // Row modification

            for (int j = n - 1; j < nn; j++) {
              z           = H(n - 1, j);
              H(n - 1, j) = q * z + p * H(n, j);
              H(n, j)     = q * H(n, j) - p * z;
            }

            // Column modification

            for (int i = 0; i <= n; i++) {
              z           = H(i, n - 1);
              H(i, n - 1) = q * z + p * H(i, n);
              H(i, n)     = q * H(i, n) - p * z;
            }

            // Accumulate transformations

            for (int i = low; i <= high; i++) {
              z           = V(i, n - 1);
              V(i, n - 1) = q * z + p * V(i, n);
              V(i, n)     = q * V(i, n) - p * z;
            }

            // Complex pair

          } else {
            d(n - 1) = x + p;
            d(n)     = x + p;
            e(n - 1) = z;
            e(n)     = -z;
          }
          n    = n - 2;
          iter = 0;

          // No convergence yet

        } else {
          // Form shift

          x = H(n, n);
          y = 0.0;
          w = 0.0;
          if (l < n) {
            y = H(n - 1, n - 1);
            w = H(n, n - 1) * H(n - 1, n);
          }

          // Wilkinson's original ad hoc shift

          if (iter == 10) {
            exshift += x;
            for (int i = low; i <= n; i++) {
              H(i, i) -= x;
            }
            s = abs(H(n, n - 1)) + abs(H(n - 1, n - 2));
            x = y = 0.75 * s;
            w     = -0.4375 * s * s;
          }

          // MATLAB's new ad hoc shift

          if (iter == 30) {
            s = (y - x) / 2.0;
            s = s * s + w;
            if (s > 0) {
              s = sqrt(s);
              if (y < x) { s = -s; }
              s = x - w / ((y - x) / 2.0 + s);
              for (int i = low; i <= n; i++) {
                H(i, i) -= s;
              }
              exshift += s;
              x = y = w = 0.964;
            }
          }

          iter = iter + 1;  // (Could check iteration count here.)

          // Look for two consecutive small sub-diagonal elements

          int m = n - 2;
          while (m >= l) {
            z = H(m, m);
            r = x - z;
            s = y - z;
            p = (r * s - w) / H(m + 1, m) + H(m, m + 1);
            q = H(m + 1, m + 1) - z - r - s;
            r = H(m + 2, m + 1);
            s = abs(p) + abs(q) + abs(r);
            p = p / s;
            q = q / s;
            r = r / s;
            if (m == l) { break; }
            if (abs(H(m, m - 1)) * (abs(q) + abs(r)) <
                eps * (abs(p) * (abs(H(m - 1, m - 1)) + abs(z) +
                                 abs(H(m + 1, m + 1))))) {
              break;
            }
            m--;
          }

          for (int i = m + 2; i <= n; i++) {
            H(i, i - 2) = 0.0;
            if (i > m + 2) { H(i, i - 3) = 0.0; }
          }

          // Double QR step involving rows l:n and columns m:n

          for (int k = m; k <= n - 1; k++) {
            int notlast = (k != n - 1);
            if (k != m) {
              p = H(k, k - 1);
              q = H(k + 1, k - 1);
              r = (notlast ? H(k + 2, k - 1) : 0.0);
              x = abs(p) + abs(q) + abs(r);
              if (x != 0.0) {
                p = p / x;
                q = q / x;
                r = r / x;
              }
            }
            if (x == 0.0) { break; }
            s = sqrt(p * p + q * q + r * r);
            if (p < 0) { s = -s; }
            if (s != 0) {
              if (k != m) {
                H(k, k - 1) = -s * x;
              } else if (l != m) {
                H(k, k - 1) = -H(k, k - 1);
              }
              p = p + s;
              x = p / s;
              y = q / s;
              z = r / s;
              q = q / p;
              r = r / p;

              // Row modification

              for (int j = k; j < nn; j++) {
                p = H(k, j) + q * H(k + 1, j);
                if (notlast) {
                  p           = p + r * H(k + 2, j);
                  H(k + 2, j) = H(k + 2, j) - p * z;
                }
                H(k, j)     = H(k, j) - p * x;
                H(k + 1, j) = H(k + 1, j) - p * y;
              }

              // Column modification

              for (int i = 0; i <= min(n, k + 3); i++) {
                p = x * H(i, k) + y * H(i, k + 1);
                if (notlast) {
                  p           = p + z * H(i, k + 2);
                  H(i, k + 2) = H(i, k + 2) - p * r;
                }
                H(i, k)     = H(i, k) - p;
                H(i, k + 1) = H(i, k + 1) - p * q;
              }

              // Accumulate transformations

              for (int i = low; i <= high; i++) {
                p = x * V(i, k) + y * V(i, k + 1);
                if (notlast) {
                  p           = p + z * V(i, k + 2);
                  V(i, k + 2) = V(i, k + 2) - p * r;
                }
                V(i, k)     = V(i, k) - p;
                V(i, k + 1) = V(i, k + 1) - p * q;
              }
            }  // (s != 0)
          }    // k loop
        }      // check convergence
      }        // while (n >= low)

      // Backsubstitute to find vectors of upper triangular form

      if (norm == 0.0) { return; }

      for (n = nn - 1; n >= 0; n--) {
        p = d(n);
        q = e(n);

        // Real vector

        if (q == 0) {
          int l   = n;
          H(n, n) = 1.0;
          for (int i = n - 1; i >= 0; i--) {
            w = H(i, i) - p;
            r = 0.0;
            for (int j = l; j <= n; j++) {
              r = r + H(i, j) * H(j, n);
            }
            if (e(i) < 0.0) {
              z = w;
              s = r;
            } else {
              l = i;
              if (e(i) == 0.0) {
                if (w != 0.0) {
                  H(i, n) = -r / w;
                } else {
                  H(i, n) = -r / (eps * norm);
                }

                // Solve real equations

              } else {
                x       = H(i, i + 1);
                y       = H(i + 1, i);
                q       = (d(i) - p) * (d(i) - p) + e(i) * e(i);
                t       = (x * s - z * r) / q;
                H(i, n) = t;
                if (abs(x) > abs(z)) {
                  H(i + 1, n) = (-r - w * t) / x;
                } else {
                  H(i + 1, n) = (-s - y * t) / z;
                }
              }

              // Overflow control

              t = abs(H(i, n));
              if ((eps * t) * t > 1) {
                for (int j = i; j <= n; j++) {
                  H(j, n) = H(j, n) / t;
                }
              }
            }
          }

          // Complex vector

        } else if (q < 0) {
          int l = n - 1;

          // Last vector component imaginary so matrix is triangular

          if (abs(H(n, n - 1)) > abs(H(n - 1, n))) {
            H(n - 1, n - 1) = q / H(n, n - 1);
            H(n - 1, n)     = -(H(n, n) - p) / H(n, n - 1);
          } else {
            cdiv(0.0, -H(n - 1, n), H(n - 1, n - 1) - p, q);
            H(n - 1, n - 1) = cdivr;
            H(n - 1, n)     = cdivi;
          }
          H(n, n - 1) = 0.0;
          H(n, n)     = 1.0;
          for (int i = n - 2; i >= 0; i--) {
            Real ra, sa, vr, vi;
            ra = 0.0;
            sa = 0.0;
            for (int j = l; j <= n; j++) {
              ra = ra + H(i, j) * H(j, n - 1);
              sa = sa + H(i, j) * H(j, n);
            }
            w = H(i, i) - p;

            if (e(i) < 0.0) {
              z = w;
              r = ra;
              s = sa;
            } else {
              l = i;
              if (e(i) == 0) {
                cdiv(-ra, -sa, w, q);
                H(i, n - 1) = cdivr;
                H(i, n)     = cdivi;
              } else {
                // Solve complex equations

                x  = H(i, i + 1);
                y  = H(i + 1, i);
                vr = (d(i) - p) * (d(i) - p) + e(i) * e(i) - q * q;
                vi = (d(i) - p) * 2.0 * q;
                if ((vr == 0.0) && (vi == 0.0)) {
                  vr =
                      eps * norm * (abs(w) + abs(q) + abs(x) + abs(y) + abs(z));
                }
                cdiv(x * r - z * ra + q * sa, x * s - z * sa - q * ra, vr, vi);
                H(i, n - 1) = cdivr;
                H(i, n)     = cdivi;
                if (abs(x) > (abs(z) + abs(q))) {
                  H(i + 1, n - 1) = (-ra - w * H(i, n - 1) + q * H(i, n)) / x;
                  H(i + 1, n)     = (-sa - w * H(i, n) - q * H(i, n - 1)) / x;
                } else {
                  cdiv(-r - y * H(i, n - 1), -s - y * H(i, n), z, q);
                  H(i + 1, n - 1) = cdivr;
                  H(i + 1, n)     = cdivi;
                }
              }

              // Overflow control

              t = max(abs(H(i, n - 1)), abs(H(i, n)));
              if ((eps * t) * t > 1) {
                for (int j = i; j <= n; j++) {
                  H(j, n - 1) = H(j, n - 1) / t;
                  H(j, n)     = H(j, n) / t;
                }
              }
            }
          }
        }
      }

      // Vectors of isolated roots

      for (int i = 0; i < nn; i++) {
        if (i < low || i > high) {
          for (int j = i; j < nn; j++) {
            V(i, j) = H(i, j);
          }
        }
      }

      // Back transformation to get eigenvectors of original matrix

      for (int j = nn - 1; j >= low; j--) {
        for (int i = low; i <= high; i++) {
          z = 0.0;
          for (int k = low; k <= min(j, high); k++) {
            z = z + V(i, k) * H(k, j);
          }
          V(i, j) = z;
        }
      }
    }